

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleServer.cpp
# Opt level: O0

void __thiscall CustomServer::CustomServer(CustomServer *this,uint16_t port)

{
  uint16_t port_local;
  CustomServer *this_local;
  
  blcl::net::server_interface<MsgType>::server_interface
            (&this->super_server_interface<MsgType>,port);
  (this->super_server_interface<MsgType>)._vptr_server_interface =
       (_func_int **)&PTR__CustomServer_0014d340;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::unordered_map(&this->fail2ban_counter_);
  this->max_fail_attempt = 10;
  return;
}

Assistant:

CustomServer(uint16_t port) : blcl::net::server_interface<MsgType>(port) {

    }